

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

int decompress_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  jpeg_d_coef_controller *pjVar2;
  inverse_DCT_method_ptr p_Var3;
  int iVar4;
  JBLOCKARRAY ppaJVar5;
  jpeg_decomp_master *pjVar6;
  uint uVar7;
  JSAMPARRAY ppJVar8;
  long lVar9;
  ulong uVar10;
  JDIMENSION JVar11;
  ulong uVar12;
  JBLOCKROW paJVar13;
  jpeg_component_info *pjVar14;
  
  pjVar2 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while ((cinfo->input_scan_number < cinfo->output_scan_number ||
         ((cinfo->input_scan_number == cinfo->output_scan_number &&
          (cinfo->input_iMCU_row <= cinfo->output_iMCU_row))))) {
    iVar4 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar4 == 0) {
      return 0;
    }
  }
  pjVar14 = cinfo->comp_info;
  for (lVar9 = 0; lVar9 < cinfo->num_components; lVar9 = lVar9 + 1) {
    if (pjVar14->component_needed != 0) {
      ppaJVar5 = (*cinfo->mem->access_virt_barray)
                           ((j_common_ptr)cinfo,
                            (jvirt_barray_ptr)(&pjVar2[3].decompress_data)[lVar9],
                            cinfo->output_iMCU_row * pjVar14->v_samp_factor,pjVar14->v_samp_factor,0
                           );
      if (cinfo->output_iMCU_row < JVar1 - 1) {
        uVar7 = pjVar14->v_samp_factor;
      }
      else {
        uVar7 = pjVar14->height_in_blocks % (uint)pjVar14->v_samp_factor;
        if (uVar7 == 0) {
          uVar7 = pjVar14->v_samp_factor;
        }
      }
      p_Var3 = cinfo->idct->inverse_DCT[lVar9];
      ppJVar8 = output_buf[lVar9];
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
        pjVar6 = cinfo->master;
        uVar12 = (ulong)pjVar6->first_MCU_col[lVar9];
        paJVar13 = ppaJVar5[uVar10] + uVar12;
        JVar11 = 0;
        for (; (uint)uVar12 <= pjVar6->last_MCU_col[lVar9]; uVar12 = (ulong)((uint)uVar12 + 1)) {
          (*p_Var3)(cinfo,pjVar14,*paJVar13,ppJVar8,JVar11);
          paJVar13 = paJVar13 + 1;
          JVar11 = JVar11 + pjVar14->DCT_scaled_size;
          pjVar6 = cinfo->master;
        }
        ppJVar8 = ppJVar8 + pjVar14->DCT_scaled_size;
      }
    }
    pjVar14 = pjVar14 + 1;
  }
  uVar7 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar7;
  return 4 - (uint)(uVar7 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num;
  int ci, block_row, block_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number < cinfo->output_scan_number ||
         (cinfo->input_scan_number == cinfo->output_scan_number &&
          cinfo->input_iMCU_row <= cinfo->output_iMCU_row)) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       cinfo->output_iMCU_row * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, FALSE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];
      output_col = 0;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)buffer_ptr, output_ptr,
                        output_col);
        buffer_ptr++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}